

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

MontyContext * monty_new(mp_int *modulus)

{
  MontyContext *mc_00;
  mp_int *pmVar1;
  mp_int *pmVar2;
  size_t nw;
  ulong local_28;
  size_t j;
  mp_int *r;
  MontyContext *mc;
  mp_int *modulus_local;
  
  mc_00 = (MontyContext *)safemalloc(1,0x48,0);
  mc_00->rw = modulus->nw;
  mc_00->rbits = mc_00->rw << 6;
  mc_00->pw = mc_00->rw * 2 + 1;
  pmVar1 = mp_copy(modulus);
  mc_00->m = pmVar1;
  pmVar1 = mp_invert_mod_2to(mc_00->m,mc_00->rbits);
  mc_00->minus_minv_mod_r = pmVar1;
  mp_neg_into(mc_00->minus_minv_mod_r,mc_00->minus_minv_mod_r);
  pmVar1 = mp_make_sized(mc_00->rw + 1);
  pmVar1->w[mc_00->rw] = 1;
  pmVar2 = mp_mod(pmVar1,mc_00->m);
  mc_00->powers_of_r_mod_m[0] = pmVar2;
  mp_free(pmVar1);
  for (local_28 = 1; local_28 < 3; local_28 = local_28 + 1) {
    pmVar1 = mp_modmul(mc_00->powers_of_r_mod_m[0],mc_00->powers_of_r_mod_m[local_28 - 1],mc_00->m);
    mc_00->powers_of_r_mod_m[local_28] = pmVar1;
  }
  nw = monty_scratch_size(mc_00);
  pmVar1 = mp_make_sized(nw);
  mc_00->scratch = pmVar1;
  return mc_00;
}

Assistant:

MontyContext *monty_new(mp_int *modulus)
{
    MontyContext *mc = snew(MontyContext);

    mc->rw = modulus->nw;
    mc->rbits = mc->rw * BIGNUM_INT_BITS;
    mc->pw = mc->rw * 2 + 1;

    mc->m = mp_copy(modulus);

    mc->minus_minv_mod_r = mp_invert_mod_2to(mc->m, mc->rbits);
    mp_neg_into(mc->minus_minv_mod_r, mc->minus_minv_mod_r);

    mp_int *r = mp_make_sized(mc->rw + 1);
    r->w[mc->rw] = 1;
    mc->powers_of_r_mod_m[0] = mp_mod(r, mc->m);
    mp_free(r);

    for (size_t j = 1; j < lenof(mc->powers_of_r_mod_m); j++)
        mc->powers_of_r_mod_m[j] = mp_modmul(
            mc->powers_of_r_mod_m[0], mc->powers_of_r_mod_m[j-1], mc->m);

    mc->scratch = mp_make_sized(monty_scratch_size(mc));

    return mc;
}